

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O0

char * zt_opt_error_str(int code,char *fmt,...)

{
  char in_AL;
  char *pcVar1;
  __va_list_tag *in_R9;
  char *in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  va_list ap;
  char *ret;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int code_00;
  
  code_00 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff48 = in_XMM0_Qa;
    code_00 = (int)((ulong)in_XMM0_Qb >> 0x20);
  }
  pcVar1 = zt_opt_verror_str(code_00,in_stack_ffffffffffffff48,in_R9);
  return pcVar1;
}

Assistant:

char *
zt_opt_error_str(int code, char * fmt, ...) {
    char  * ret;
    va_list ap;

    va_start(ap, fmt);
    ret = zt_opt_verror_str(code, fmt, ap);
    va_end(ap);
    return ret;
}